

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O0

void __thiscall MDPValueIteration::PlanSlow(MDPValueIteration *this)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  PlanningUnitDecPOMDPDiscrete *this_00;
  reference pdVar4;
  double *pdVar5;
  void *pvVar6;
  size_type sVar7;
  const_reference pdVar8;
  reference pvVar9;
  reference ppcVar10;
  int __x;
  MDPSolver *in_RDI;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint a_1;
  Index jasucI_1;
  const_iterator2 ci;
  const_iterator1 ri;
  Index jaI_2;
  Index ssucI_1;
  Index sI_2;
  uint s1;
  uint s;
  uint a;
  double p;
  CMatrix *Ta;
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  T;
  QTable oldQtable;
  double gamma;
  double maxDelta;
  Index jasucI;
  Index ssucI;
  Index jaI_1;
  Index sI_1;
  size_t t;
  Index jaI;
  Index sI;
  QTable immReward;
  double maxQsuc;
  double R_f;
  double R_i;
  size_t nrJA;
  size_t nrS;
  size_t horizon;
  Index in_stack_fffffffffffffb38;
  Index in_stack_fffffffffffffb3c;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffb40;
  QTable *this_01;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffb48;
  value_type in_stack_fffffffffffffb50;
  const_iterator1 *in_stack_fffffffffffffb58;
  QTable *in_stack_fffffffffffffb60;
  const_iterator1 *in_stack_fffffffffffffb68;
  allocator<char> *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  const_iterator1 *in_stack_fffffffffffffb80;
  size_type in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  size_type in_stack_fffffffffffffbc8;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffbd0;
  MDPValueIteration *in_stack_fffffffffffffc20;
  allocator<char> local_359;
  string local_358 [32];
  uint local_338;
  allocator<char> local_331;
  string local_330 [32];
  allocator<char> *local_310;
  uint local_304;
  undefined4 local_29c;
  uint local_1d8;
  allocator<char> local_1d1;
  string local_1d0 [36];
  undefined4 local_1ac;
  undefined4 local_1a8;
  allocator<char> local_1a1;
  string local_1a0 [68];
  uint local_15c;
  uint local_158;
  allocator<char> local_151;
  string local_150 [36];
  uint local_12c;
  double local_128;
  void *local_120;
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_118 [3];
  double local_d0;
  container_type *local_c8;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  size_t local_b0;
  uint local_a8;
  uint local_a4;
  double local_70;
  double local_68;
  double local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  allocator<char> local_29;
  string local_28 [40];
  
  if (((ulong)in_RDI[3]._m_pu & 1) == 0) {
    Initialize(in_stack_fffffffffffffc20);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffffb40,
             (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  this_00 = MDPSolver::GetPU(in_RDI);
  local_48 = PlanningUnit::GetHorizon((PlanningUnit *)this_00);
  MDPSolver::GetPU(in_RDI);
  local_50 = PlanningUnitMADPDiscrete::GetNrStates
                       (&in_stack_fffffffffffffb40->super_PlanningUnitMADPDiscrete);
  MDPSolver::GetPU(in_RDI);
  local_58 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x86fe39);
  QTable::QTable(in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58,
                 (size_t)in_stack_fffffffffffffb50);
  for (local_a4 = 0; local_a4 < local_50; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; local_a8 < local_58; local_a8 = local_a8 + 1) {
      MDPSolver::GetPU(in_RDI);
      dVar11 = PlanningUnitDecPOMDPDiscrete::GetReward
                         (in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                          in_stack_fffffffffffffb38);
      pdVar4 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffb40,
                            CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0x86fefa);
      *pdVar4 = dVar11;
    }
  }
  sVar1 = local_48;
  if (((ulong)in_RDI[3]._m_pu & 0x100) == 0) {
    local_c8 = (container_type *)0x7fefffffffffffff;
    MDPSolver::GetPU(in_RDI);
    local_d0 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8702ec);
    QTable::QTable((QTable *)in_stack_fffffffffffffb50);
    std::
    vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::vector((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              *)0x870325);
    for (local_12c = 0; local_12c != local_58; local_12c = local_12c + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TimedAlgorithm::StartTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffb40,
                 (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator(&local_151);
      pvVar6 = operator_new(0x70);
      boost::numeric::ublas::
      compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::compressed_matrix(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                          CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                          in_stack_fffffffffffffbb8);
      local_120 = pvVar6;
      for (local_158 = 0; local_158 != local_50; local_158 = local_158 + 1) {
        for (local_15c = 0; local_15c != local_50; local_15c = local_15c + 1) {
          MDPSolver::GetPU(in_RDI);
          local_128 = PlanningUnitMADPDiscrete::GetTransitionProbability
                                (&in_stack_fffffffffffffb40->super_PlanningUnitMADPDiscrete,
                                 in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38,0);
          if (0.0 < local_128) {
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::operator()(in_stack_fffffffffffffb48,(size_type)in_stack_fffffffffffffb40,
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            boost::numeric::ublas::
            sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ::operator=((sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                         *)in_stack_fffffffffffffb40,
                        (double *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            boost::numeric::ublas::
            sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            ::~sparse_matrix_element
                      ((sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                        *)0x8704f9);
          }
        }
      }
      std::
      vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::push_back((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                   *)in_stack_fffffffffffffb50,(value_type *)in_stack_fffffffffffffb48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffb40,
                 (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
    }
    while (0.0001 < (double)local_c8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TimedAlgorithm::StartTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffb40,
                 (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      local_c8 = (container_type *)0x0;
      std::vector<QTable,_std::allocator<QTable>_>::operator[]
                ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),0);
      QTable::operator=((QTable *)in_stack_fffffffffffffb40,
                        (QTable *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      for (local_1d8 = 0; local_1d8 < local_58; local_1d8 = local_1d8 + 1) {
        std::
        vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
        ::operator[](local_118,(ulong)local_1d8);
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::begin1((compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator1::const_iterator1
                  ((const_iterator1 *)in_stack_fffffffffffffb40,
                   (iterator1 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::iterator1::~iterator1((iterator1 *)0x870803);
        while( true ) {
          std::
          vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ::operator[](local_118,(ulong)local_1d8);
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::end1((compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::const_iterator1
                    ((const_iterator1 *)in_stack_fffffffffffffb40,
                     (iterator1 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          bVar2 = boost::numeric::ublas::
                  bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double>
                  ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator1,_double>
                                *)in_stack_fffffffffffffb40,
                               (derived_iterator_type *)
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::~const_iterator1((const_iterator1 *)0x87086d);
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::iterator1::~iterator1((iterator1 *)0x87087a);
          if (!bVar2) break;
          sVar7 = boost::numeric::ublas::
                  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::const_iterator1::index1((const_iterator1 *)in_stack_fffffffffffffb48);
          local_1a8 = (undefined4)sVar7;
          pdVar4 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffb40,
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                0x8709bc);
          local_60 = *pdVar4;
          local_68 = 0.0;
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::begin(in_stack_fffffffffffffb58);
          while( true ) {
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator1::end(in_stack_fffffffffffffb68);
            bVar3 = boost::numeric::ublas::
                    bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double>
                    ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator2,_double>
                                  *)in_stack_fffffffffffffb40,
                                 (derived_iterator_type *)
                                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator2::~const_iterator2((const_iterator2 *)0x870a42);
            if ((bVar3 & 1) == 0) break;
            sVar7 = boost::numeric::ublas::
                    compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    ::const_iterator2::index2((const_iterator2 *)in_stack_fffffffffffffb48);
            local_1ac = (undefined4)sVar7;
            local_70 = -1.79769313486232e+308;
            for (local_304 = 0; local_304 < local_58; local_304 = local_304 + 1) {
              pdVar4 = boost::numeric::ublas::
                       matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                     *)in_stack_fffffffffffffb40,
                                    CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                    0x870b1b);
              pdVar5 = std::max<double>(pdVar4,&local_70);
              local_70 = *pdVar5;
            }
            pdVar8 = boost::numeric::ublas::
                     compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     ::const_iterator2::operator*((const_iterator2 *)in_stack_fffffffffffffb48);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = *pdVar8;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_70;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_68;
            auVar14 = vfmadd213sd_fma(auVar13,auVar16,auVar19);
            local_68 = auVar14._0_8_;
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::const_iterator2::operator++((const_iterator2 *)in_stack_fffffffffffffb80);
          }
          local_29c = 0x28;
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator2::~const_iterator2((const_iterator2 *)0x870a65);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_60;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_d0;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_68;
          auVar14 = vfmadd213sd_fma(auVar14,auVar17,auVar20);
          std::vector<QTable,_std::allocator<QTable>_>::operator[]
                    ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),0);
          pdVar4 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffb40,
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                0x870c1c);
          *pdVar4 = auVar14._0_8_;
          pdVar4 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffb40,
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                0x870c51);
          in_stack_fffffffffffffb78 = (char *)*pdVar4;
          pvVar9 = std::vector<QTable,_std::allocator<QTable>_>::operator[]
                             ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),0);
          __x = (int)pvVar9 + 8;
          in_stack_fffffffffffffb80 =
               (const_iterator1 *)
               boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffb40,
                            CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0x870c9a);
          in_stack_fffffffffffffb70 =
               (allocator<char> *)
               ((double)in_stack_fffffffffffffb78 -
               (double)(in_stack_fffffffffffffb80->
                       super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                       ).c_);
          std::abs(__x);
          local_310 = in_stack_fffffffffffffb70;
          in_stack_fffffffffffffb68 =
               (const_iterator1 *)std::max<double>((double *)&local_c8,(double *)&local_310);
          local_c8 = (in_stack_fffffffffffffb68->
                     super_container_const_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                     ).c_;
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::const_iterator1::operator++(in_stack_fffffffffffffb80);
        }
        local_29c = 0x25;
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator1::~const_iterator1((const_iterator1 *)0x8708a1);
      }
      in_stack_fffffffffffffb58 = (const_iterator1 *)(in_RDI + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffb40,
                 (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator(&local_331);
    }
    for (local_338 = 0; local_338 != local_58; local_338 = local_338 + 1) {
      ppcVar10 = std::
                 vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 ::operator[](local_118,(ulong)local_338);
      in_stack_fffffffffffffb50 = *ppcVar10;
      if (in_stack_fffffffffffffb50 != (value_type)0x0) {
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~compressed_matrix
                  ((compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)in_stack_fffffffffffffb40);
        operator_delete(in_stack_fffffffffffffb50,0x70);
      }
    }
    std::
    vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ::~vector((vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
               *)in_stack_fffffffffffffb50);
    QTable::~QTable((QTable *)in_stack_fffffffffffffb40);
  }
  else {
    do {
      local_b0 = sVar1 - 1;
      for (local_b4 = 0; local_b4 < local_50; local_b4 = local_b4 + 1) {
        for (local_b8 = 0; local_b8 < local_58; local_b8 = local_b8 + 1) {
          pdVar4 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffb40,
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                0x870039);
          local_60 = *pdVar4;
          local_68 = 0.0;
          if (local_b0 < local_48 - 1) {
            for (local_bc = 0; local_bc < local_50; local_bc = local_bc + 1) {
              local_70 = -1.79769313486232e+308;
              for (local_c0 = 0; local_c0 < local_58; local_c0 = local_c0 + 1) {
                std::vector<QTable,_std::allocator<QTable>_>::operator[]
                          ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),local_b0 + 1);
                pdVar4 = boost::numeric::ublas::
                         matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                         ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                       *)in_stack_fffffffffffffb40,
                                      CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                      0x87010d);
                pdVar5 = std::max<double>(pdVar4,&local_70);
                local_70 = *pdVar5;
              }
              MDPSolver::GetPU(in_RDI);
              dVar11 = PlanningUnitMADPDiscrete::GetTransitionProbability
                                 (&in_stack_fffffffffffffb40->super_PlanningUnitMADPDiscrete,
                                  in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38,0);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = dVar11;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = local_70;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_68;
              auVar14 = vfmadd213sd_fma(auVar12,auVar15,auVar18);
              local_68 = auVar14._0_8_;
            }
          }
          dVar11 = local_60 + local_68;
          std::vector<QTable,_std::allocator<QTable>_>::operator[]
                    ((vector<QTable,_std::allocator<QTable>_> *)(in_RDI + 2),local_b0);
          pdVar4 = boost::numeric::ublas::
                   matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffb40,
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                0x87023c);
          *pdVar4 = dVar11;
        }
      }
      sVar1 = local_b0;
    } while (local_b0 != 0);
  }
  this_01 = (QTable *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)this_01,
             (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  QTable::~QTable(this_01);
  return;
}

Assistant:

void MDPValueIteration::PlanSlow()
{
    if(!_m_initialized)
        Initialize();

    StartTimer("Plan");

    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    double R_i,R_f,maxQsuc;

    // cache immediate reward for speed
    QTable immReward(nrS,nrJA);
    for(Index sI = 0; sI < nrS; sI++)
        for(Index jaI = 0; jaI < nrJA; jaI++)
            immReward(sI,jaI)=GetPU()->GetReward(sI, jaI);

   
    if(_m_finiteHorizon)
    {
        for(size_t t = horizon - 1; true; t--)
        {
            for(Index sI = 0; sI < nrS; sI++)
            {
                for(Index jaI = 0; jaI < nrJA; jaI++)
                {
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    if(t < horizon - 1)
                    {
                        //calc. expected future reward
                        for(Index ssucI = 0; ssucI < nrS; ssucI++)
                        {
                            //find the best action at ssucI
                            maxQsuc = -DBL_MAX;
                            for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                                maxQsuc = max( _m_QValues[t+1](ssucI,jasucI),
                                               maxQsuc);
                            
                            R_f += GetPU()->GetTransitionProbability(sI, jaI,
                                                                     ssucI)
                                * maxQsuc;
                        }//done calc. expected future reward
                    }
                    _m_QValues[t](sI,jaI) = R_i + R_f;
                }//end for jaI
            }//end for sI
            if(t == 0) //escape from (loop t is unsigned!)
                break;
        }
    }
    else // infinite horizon problem
    {
        double maxDelta=DBL_MAX;
        double gamma=GetPU()->GetDiscount();
        QTable oldQtable;

        // in infinite-horizon case, it is typically worth to cache
        // the transition model
        typedef boost::numeric::ublas::compressed_matrix<double> CMatrix;
        vector<CMatrix*> T;
        CMatrix *Ta;
        double p;
        for(unsigned int a=0;a!=nrJA;++a)
        {
#if DEBUG_MDPValueIteration
            PrintTimersSummary();
#endif
            StartTimer("CacheTransitionModel");
            Ta=new CMatrix(nrS,nrS);

            for(unsigned int s=0;s!=nrS;++s)
                for(unsigned int s1=0;s1!=nrS;++s1)
                {
                    p=GetPU()->GetTransitionProbability(s,a,s1);
                    if(p>0)
                        (*Ta)(s,s1)=p;
                }

            T.push_back(Ta);
            StopTimer("CacheTransitionModel");
        }

        Index sI,ssucI;
        while(maxDelta>1e-4)
        {
            StartTimer("Iteration");
            maxDelta=0;
            oldQtable=_m_QValues[0];
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(CMatrix::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();

                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    //calc. expected future reward
                    
                    for (CMatrix::const_iterator2 ci = ri.begin();
                         ci != ri.end(); ++ci)
                    {
                        ssucI=ci.index2();

                        //find the best action at ssucI
                        maxQsuc = -DBL_MAX;
                        for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                            maxQsuc = max( oldQtable(ssucI,jasucI),
                                           maxQsuc);
                            
                        R_f += *ci * maxQsuc;
                    }//done calc. expected future reward

                    _m_QValues[0](sI,jaI) = R_i + gamma*R_f;
                    maxDelta=max(maxDelta,abs(oldQtable(sI,jaI)-
                                              _m_QValues[0](sI,jaI)));
                }//end for jaI
            }//end for sI

            StopTimer("Iteration");

#if DEBUG_MDPValueIteration
            cout << "delta " << maxDelta << endl;
            PrintTimersSummary();
#endif
        }

        for(unsigned int a=0;a!=nrJA;++a)
            delete T[a];
    }

    StopTimer("Plan");

#if DEBUG_MDPValueIteration
    PrintTimersSummary();
#endif
}